

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringtokenizer.h
# Opt level: O1

void __thiscall
QStringTokenizerBase<QStringView,_QChar>::iterator::iterator
          (iterator *this,QStringTokenizerBase<QStringView,_QChar> *t)

{
  storage_type_conflict *psVar1;
  long lVar2;
  long from;
  long lVar3;
  long lVar4;
  
  this->tokenizer = t;
  lVar2 = 0;
  lVar3 = 0;
  do {
    from = lVar3;
    if (lVar2 < 0) {
      (this->current).value.m_size = 0;
      (this->current).value.m_data = (storage_type_conflict *)0x0;
      (this->current).ok = false;
      (this->current).state.start = from;
      goto LAB_00524100;
    }
    lVar2 = QStringView::indexOf
                      (&t->m_haystack,(QChar)(char16_t)*(undefined4 *)&t->m_needle,from,
                       (t->super_QStringTokenizerBaseBase).m_cs);
    if (lVar2 < 0) {
      lVar3 = from;
      lVar4 = (t->m_haystack).m_size;
    }
    else {
      lVar3 = lVar2 + 1;
      lVar4 = lVar2;
    }
  } while ((((t->super_QStringTokenizerBaseBase).m_sb.
             super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
             super_QFlagsStorage<Qt::SplitBehaviorFlags>.i & 1) != 0) && (lVar4 == from));
  psVar1 = (t->m_haystack).m_data;
  (this->current).value.m_size = lVar4 - from;
  (this->current).value.m_data = psVar1 + from;
  (this->current).ok = true;
  (this->current).state.start = lVar3;
LAB_00524100:
  (this->current).state.end = lVar2;
  (this->current).state.extra = 0;
  return;
}

Assistant:

explicit iterator(const QStringTokenizerBase &t) noexcept
            : tokenizer{&t}, current{t.toFront()} {}